

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

int Alg::cal_k_max(vector<double,_std::allocator<double>_> *budget_list,double budget)

{
  iterator __first;
  iterator __last;
  size_type sVar1;
  reference pvVar2;
  undefined4 local_34;
  int i;
  undefined4 local_1c;
  double dStack_18;
  int count;
  double budget_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  
  local_1c = 0;
  __first = std::vector<double,_std::allocator<double>_>::begin(budget_list);
  __last = std::vector<double,_std::allocator<double>_>::end(budget_list);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  local_34 = 0;
  dStack_18 = budget;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(budget_list);
    if (sVar1 <= (ulong)(long)local_34) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(long)local_34);
    if (*pvVar2 <= dStack_18 && dStack_18 != *pvVar2) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(long)local_34);
      if (0.001 < ABS(*pvVar2)) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (budget_list,(long)local_34);
        dStack_18 = dStack_18 - *pvVar2;
        local_1c = local_1c + 1;
      }
    }
    local_34 = local_34 + 1;
  }
  return local_1c;
}

Assistant:

int Alg::cal_k_max(std::vector<double> budget_list, double budget) {
    int count = 0;
    std::sort(budget_list.begin(), budget_list.end());
    for(int i = 0; i < budget_list.size(); i++) {
        if (budget > budget_list[i] && fabs(budget_list[i]) > 0.001) {
            budget = budget - budget_list[i];
            count = count + 1;
        }
    }
    return count;
}